

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::SplitProgramFromArgs(string *command,string *program,string *args)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool in_single;
  bool in_double;
  byte *pbStack_28;
  bool in_escape;
  char *c;
  string *args_local;
  string *program_local;
  string *command_local;
  
  pbStack_28 = (byte *)std::__cxx11::string::c_str();
  while (iVar5 = isspace((uint)*pbStack_28), iVar5 != 0) {
    pbStack_28 = pbStack_28 + 1;
  }
  bVar3 = false;
  bVar1 = 0;
  bVar2 = false;
  for (; *pbStack_28 != 0; pbStack_28 = pbStack_28 + 1) {
    if (bVar2) {
      if (*pbStack_28 == 0x27) {
        bVar2 = false;
      }
      else {
        std::__cxx11::string::operator+=((string *)program,*pbStack_28);
      }
    }
    else if (bVar3) {
      bVar3 = false;
      std::__cxx11::string::operator+=((string *)program,*pbStack_28);
    }
    else if (*pbStack_28 == 0x5c) {
      bVar3 = true;
    }
    else if (bVar1 == 0) {
      if (*pbStack_28 == 0x22) {
        bVar1 = 1;
      }
      else if (*pbStack_28 == 0x27) {
        bVar2 = true;
      }
      else {
        iVar5 = isspace((uint)*pbStack_28);
        if (iVar5 != 0) break;
        std::__cxx11::string::operator+=((string *)program,*pbStack_28);
      }
    }
    else if (*pbStack_28 == 0x22) {
      bVar1 = 0;
    }
    else {
      std::__cxx11::string::operator+=((string *)program,*pbStack_28);
    }
  }
  std::__cxx11::string::operator=((string *)args,(char *)pbStack_28);
  bVar4 = false;
  if ((!bVar2) && (bVar4 = false, !bVar3)) {
    bVar4 = (bool)(bVar1 ^ 1);
  }
  return bVar4;
}

Assistant:

bool cmSystemTools::SplitProgramFromArgs(std::string const& command,
                                         std::string& program,
                                         std::string& args)
{
  const char* c = command.c_str();

  // Skip leading whitespace.
  while (isspace(static_cast<unsigned char>(*c))) {
    ++c;
  }

  // Parse one command-line element up to an unquoted space.
  bool in_escape = false;
  bool in_double = false;
  bool in_single = false;
  for (; *c; ++c) {
    if (in_single) {
      if (*c == '\'') {
        in_single = false;
      } else {
        program += *c;
      }
    } else if (in_escape) {
      in_escape = false;
      program += *c;
    } else if (*c == '\\') {
      in_escape = true;
    } else if (in_double) {
      if (*c == '"') {
        in_double = false;
      } else {
        program += *c;
      }
    } else if (*c == '"') {
      in_double = true;
    } else if (*c == '\'') {
      in_single = true;
    } else if (isspace(static_cast<unsigned char>(*c))) {
      break;
    } else {
      program += *c;
    }
  }

  // The remainder of the command line holds unparsed arguments.
  args = c;

  return !in_single && !in_escape && !in_double;
}